

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::Begin
          (ByteCodeGenerator *this,ArenaAllocator *alloc,uint32 grfscr,
          ParseableFunctionInfo *pRootFunc)

{
  bool bVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  DList<JumpCleanupInfo,_Memory::ArenaAllocator,_RealCount> *this_01;
  FunctionBody *local_a8;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  ParseableFunctionInfo *local_28;
  ParseableFunctionInfo *pRootFunc_local;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAStack_18;
  uint32 grfscr_local;
  ArenaAllocator *alloc_local;
  ByteCodeGenerator *this_local;
  
  this->alloc = alloc;
  this->flags = grfscr;
  this->pRootFunc = pRootFunc;
  local_28 = pRootFunc;
  pRootFunc_local._4_4_ = grfscr;
  pAStack_18 = &alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  alloc_local = (ArenaAllocator *)this;
  if (pRootFunc == (ParseableFunctionInfo *)0x0) {
    local_a8 = (FunctionBody *)0x0;
  }
  else {
    local_a8 = Js::FunctionProxy::GetFunctionBody(&pRootFunc->super_FunctionProxy);
  }
  this->pCurrentFunction = local_a8;
  if (((this->pCurrentFunction != (FunctionBody *)0x0) &&
      (bVar1 = Js::ParseableFunctionInfo::GetIsGlobalFunc
                         (&this->pCurrentFunction->super_ParseableFunctionInfo), bVar1)) &&
     (bVar1 = IsInNonDebugMode(this), bVar1)) {
    this->pCurrentFunction = (FunctionBody *)0x0;
  }
  pAVar2 = pAStack_18;
  this->globalScope = (Scope *)0x0;
  this->currentScope = (Scope *)0x0;
  this->currentBlock = (ParseNodeBlock *)0x0;
  this->isBinding = true;
  this->inPrologue = false;
  this->funcEscapes = false;
  this->maxAstSize = 0;
  this->loopDepth = 0;
  this->envDepth = 0;
  this->trackEnvDepth = false;
  this->funcInfosToFinalize = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&SList<FuncInfo*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
             ,0x89f);
  pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar2,&local_50);
  local_60 = Memory::ArenaAllocator::Alloc;
  local_58 = 0;
  this_00 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar2,0x3f67b0);
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::SList(this_00,(ArenaAllocator *)pAStack_18);
  pAVar2 = pAStack_18;
  this->funcInfoStack = this_00;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_88,
             (type_info *)&DList<JumpCleanupInfo,Memory::ArenaAllocator,RealCount>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
             ,0x8a0);
  pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar2,&local_88);
  this_01 = (DList<JumpCleanupInfo,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar2,0x3f67b0);
  DList<JumpCleanupInfo,_Memory::ArenaAllocator,_RealCount>::DList
            (this_01,(ArenaAllocator *)pAStack_18);
  this->jumpCleanupList = this_01;
  return;
}

Assistant:

void ByteCodeGenerator::Begin(
    __in ArenaAllocator *alloc,
    __in uint32 grfscr,
    __in Js::ParseableFunctionInfo* pRootFunc)
{
    this->alloc = alloc;
    this->flags = grfscr;
    this->pRootFunc = pRootFunc;
    this->pCurrentFunction = pRootFunc ? pRootFunc->GetFunctionBody() : nullptr;
    if (this->pCurrentFunction && this->pCurrentFunction->GetIsGlobalFunc() && IsInNonDebugMode())
    {
        // This is the deferred parse case (not due to debug mode), in which case the global function will not be marked to compiled again.
        this->pCurrentFunction = nullptr;
    }

    this->globalScope = nullptr;
    this->currentScope = nullptr;
    this->currentBlock = nullptr;
    this->isBinding = true;
    this->inPrologue = false;
    this->funcEscapes = false;
    this->maxAstSize = 0;
    this->loopDepth = 0;
    this->envDepth = 0;
    this->trackEnvDepth = false;
    this->funcInfosToFinalize = nullptr;

    this->funcInfoStack = Anew(alloc, SList<FuncInfo*>, alloc);
    this->jumpCleanupList = Anew(alloc, JumpCleanupList, alloc);
}